

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void mir::inst::display_op(ostream *o,OpAcc val)

{
  if (val == MulAdd) {
    std::operator<<(o,"MulAdd");
    return;
  }
  if (val == MulShAdd) {
    std::operator<<(o,"MulShAdd");
    return;
  }
  return;
}

Assistant:

void display_op(std::ostream& o, OpAcc val) {
  switch (val) {
    case OpAcc::MulAdd:
      o << "MulAdd";
      break;
    case OpAcc::MulShAdd:
      o << "MulShAdd";
      break;
  }
}